

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::QName::operator==(QName *this,QName *qname)

{
  uint uVar1;
  uint uVar2;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  bool local_39;
  QName *qname_local;
  QName *this_local;
  
  if ((this->fLocalPart == (XMLCh *)0x0) && (this->fPrefix == (XMLCh *)0x0)) {
    this_local._7_1_ = false;
    if (qname->fLocalPart == (XMLCh *)0x0) {
      this_local._7_1_ = qname->fPrefix == (XMLCh *)0x0;
    }
  }
  else if (this->fURIId == 0) {
    pXVar3 = getRawName(this);
    pXVar4 = getRawName(qname);
    this_local._7_1_ = XMLString::equals(pXVar3,pXVar4);
  }
  else {
    uVar1 = this->fURIId;
    uVar2 = getURI(qname);
    local_39 = false;
    if (uVar1 == uVar2) {
      pXVar3 = this->fLocalPart;
      pXVar4 = getLocalPart(qname);
      local_39 = XMLString::equals(pXVar3,pXVar4);
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool QName::operator==(const QName& qname) const
{
    // if we are an unitialized QName, check that the other is unitialized too
    if (!fLocalPart && !fPrefix)
        return !qname.fLocalPart && !qname.fPrefix;

    if (fURIId == 0) // null URI
        return (XMLString::equals(getRawName(),qname.getRawName()));

    return ((fURIId == qname.getURI()) &&
           (XMLString::equals(fLocalPart, qname.getLocalPart())));
}